

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral_enumeration_file.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  size_type sVar4;
  long in_RSI;
  pair<std::__detail::_Node_iterator<kitty::static_truth_table<4U,_true>,_true,_true>,_bool> pVar5;
  string line;
  ifstream in;
  uint ctr;
  truth_table tt;
  truth_table_set classes;
  value_type *in_stack_fffffffffffffd18;
  unordered_set<kitty::static_truth_table<4U,_true>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  string local_290 [48];
  istream local_260 [128];
  _func_void_vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>_ptr
  *in_stack_fffffffffffffe20;
  static_truth_table<4U,_true> *in_stack_fffffffffffffe28;
  uint local_54;
  static_truth_table<4U,_true> local_50 [8];
  long local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  std::
  unordered_set<kitty::static_truth_table<4U,_true>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ::unordered_set((unordered_set<kitty::static_truth_table<4U,_true>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                   *)0x1158ae);
  kitty::static_truth_table<4U,_true>::static_truth_table(local_50);
  local_54 = 0;
  std::ifstream::ifstream(local_260,*(undefined8 *)(local_10 + 8),8);
  std::__cxx11::string::string(local_290);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_260,local_290);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    kitty::create_from_hex_string<kitty::static_truth_table<4u,true>>
              ((static_truth_table<4U,_true> *)
               CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28);
    kitty::
    exact_spectral_canonization<kitty::static_truth_table<4u,true>,void(std::vector<kitty::detail::spectral_operation,std::allocator<kitty::detail::spectral_operation>>const&)>
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    pVar5 = std::
            unordered_set<kitty::static_truth_table<4U,_true>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
            ::insert(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    in_stack_fffffffffffffd37 = pVar5.second;
    local_54 = local_54 + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"[i] enumerated ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_54);
  poVar3 = std::operator<<(poVar3," functions into ");
  sVar4 = std::
          unordered_set<kitty::static_truth_table<4U,_true>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
          ::size((unordered_set<kitty::static_truth_table<4U,_true>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                  *)0x115a4e);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  poVar3 = std::operator<<(poVar3," classes.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_4 = 0;
  std::__cxx11::string::~string(local_290);
  std::ifstream::~ifstream(local_260);
  std::
  unordered_set<kitty::static_truth_table<4U,_true>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ::~unordered_set((unordered_set<kitty::static_truth_table<4U,_true>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                    *)0x115aba);
  return local_4;
}

Assistant:

int main( int argc, char ** argv )
{
  (void)argc;

  static_assert( num_vars <= 5, "number of variables is limited to 5" );

  /* truth table type in this example */
  using truth_table = kitty::static_truth_table<num_vars>;

  /* set to store all NPN and spectral representatives */
  using truth_table_set = std::unordered_set<truth_table, kitty::hash<truth_table>>;
  truth_table_set classes;

  truth_table tt;
  auto ctr = 0u;

  std::ifstream in( argv[1] );

  std::string line;
  while ( std::getline( in, line ) )
  {
    create_from_hex_string( tt, line );
    classes.insert( kitty::exact_spectral_canonization( tt ) );

    ++ctr;
  }

  std::cout << "[i] enumerated "
            << ctr << " functions into "
            << classes.size() << " classes." << std::endl;

  return 0;
}